

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::addTranslator(CoreBroker *this,ActionMessage *message)

{
  bool bVar1;
  uint uVar2;
  pointer pBVar3;
  long in_RSI;
  long *in_RDI;
  ActionMessage add;
  string *in_stack_00000140;
  BasicHandleInfo *in_stack_00000148;
  CoreBroker *in_stack_00000150;
  BasicHandleInfo *trans;
  string *in_stack_000001b0;
  BasicHandleInfo *in_stack_000001b8;
  CoreBroker *in_stack_000001c0;
  InterfaceType in_stack_00000297;
  ActionMessage *in_stack_00000298;
  CoreBroker *in_stack_000002a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  ActionMessage *this_00;
  ActionMessage *in_stack_fffffffffffffe98;
  ActionMessage *pAVar4;
  action_t startingAction;
  BasicHandleInfo *in_stack_fffffffffffffea8;
  CoreBroker *in_stack_fffffffffffffeb0;
  GlobalFederateId local_124;
  BaseType local_120;
  GlobalFederateId local_11c;
  undefined1 local_118 [15];
  InterfaceType in_stack_fffffffffffffef7;
  HandleManager *in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff00;
  InterfaceHandle in_stack_ffffffffffffff10;
  GlobalFederateId in_stack_ffffffffffffff14;
  string_view in_stack_ffffffffffffff20;
  string_view in_stack_ffffffffffffff30;
  GlobalFederateId local_58;
  undefined4 local_54;
  __sv_type local_50;
  __sv_type local_40;
  string_view local_30;
  undefined4 local_20;
  undefined4 local_1c;
  BasicHandleInfo *local_18;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = checkInterfaceCreation(in_stack_000002a0,in_stack_00000298,in_stack_00000297);
  if (bVar1) {
    local_1c = *(undefined4 *)(local_10 + 8);
    local_20 = *(undefined4 *)(local_10 + 0xc);
    local_30 = ActionMessage::name((ActionMessage *)0x5fef20);
    ActionMessage::getString_abi_cxx11_
              (in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe90);
    ActionMessage::getString_abi_cxx11_
              (in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe90);
    this_00 = (ActionMessage *)local_40._M_str;
    pAVar4 = (ActionMessage *)local_50._M_str;
    local_18 = HandleManager::addHandle
                         (in_stack_fffffffffffffef8,in_stack_ffffffffffffff14,
                          in_stack_ffffffffffffff10,in_stack_fffffffffffffef7,
                          in_stack_ffffffffffffff00,in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff30);
    addLocalInfo(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,pAVar4);
    startingAction = (action_t)((ulong)pAVar4 >> 0x20);
    if ((*(byte *)((long)in_RDI + 0x29c) & 1) == 0) {
      local_54 = 0;
      (**(code **)(*in_RDI + 0x110))(in_RDI,0,local_10);
      if ((((*(byte *)((long)in_RDI + 0x214) & 1) == 0) &&
          (*(undefined1 *)((long)in_RDI + 0x214) = 1, (*(byte *)((long)in_RDI + 0xdd) & 1) == 0)) &&
         ((*(byte *)((long)in_RDI + 0xde) & 1) == 0)) {
        pBVar3 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5ff08f);
        GlobalFederateId::GlobalFederateId(&local_58,(GlobalBrokerId)(BaseType)in_RDI[3]);
        uVar2 = (*pBVar3->_vptr_BaseTimeCoordinator[5])(pBVar3,(ulong)(uint)local_58.gid);
        if ((uVar2 & 1) != 0) {
          *(undefined1 *)((long)in_RDI + 0x211) = 1;
          local_120 = *(BaseType *)((long)in_RDI + 0x14);
          GlobalFederateId::GlobalFederateId(&local_11c,(GlobalBrokerId)local_120);
          GlobalFederateId::GlobalFederateId(&local_124,(GlobalBrokerId)(BaseType)in_RDI[3]);
          pAVar4 = (ActionMessage *)local_118;
          ActionMessage::ActionMessage
                    (pAVar4,startingAction,(GlobalFederateId)(BaseType)((ulong)pBVar3 >> 0x20),
                     (GlobalFederateId)(BaseType)pBVar3);
          setActionFlag<helics::ActionMessage,helics::TimingFlags>(pAVar4,child_flag);
          (**(code **)(*in_RDI + 0x110))(in_RDI,0,local_118);
          ActionMessage::~ActionMessage(this_00);
        }
      }
    }
    else {
      findAndNotifyInputTargets(in_stack_00000150,in_stack_00000148,in_stack_00000140);
      findAndNotifyPublicationTargets(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
      findAndNotifyEndpointTargets
                ((CoreBroker *)add.payload.bufferSize,
                 (BasicHandleInfo *)add.payload.buffer._M_elems._56_8_,
                 (string *)add.payload.buffer._M_elems._48_8_);
    }
  }
  return;
}

Assistant:

void CoreBroker::addTranslator(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::TRANSLATOR)) {
        return;
    }
    auto& trans = handles.addHandle(message.source_id,
                                    message.source_handle,
                                    InterfaceType::TRANSLATOR,
                                    message.name(),
                                    message.getString(typeStringLoc),
                                    message.getString(typeOutStringLoc));
    addLocalInfo(trans, message);

    if (!isRootc) {
        transmit(parent_route_id, message);
        if (!hasFilters) {
            hasFilters = true;
            if (!globalTime && !asyncTime) {
                if (timeCoord->addDependent(higher_broker_id)) {
                    hasTimeDependency = true;
                    ActionMessage add(CMD_ADD_DEPENDENCY, global_broker_id_local, higher_broker_id);
                    setActionFlag(add, child_flag);
                    transmit(parent_route_id, add);
                }
            }
        }
    } else {
        findAndNotifyInputTargets(trans, trans.key);
        findAndNotifyPublicationTargets(trans, trans.key);
        findAndNotifyEndpointTargets(trans, trans.key);
    }
}